

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int normal_contentTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  XML_Convert_Result XVar5;
  long lVar6;
  unsigned_short **ppuVar7;
  char **ppcVar8;
  byte *pbVar9;
  uint uVar10;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *pcVar12;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  char *extraout_RDX_11;
  char *extraout_RDX_12;
  char *extraout_RDX_13;
  char *extraout_RDX_14;
  char *extraout_RDX_15;
  char *extraout_RDX_16;
  char *extraout_RDX_17;
  char *extraout_RDX_18;
  char *extraout_RDX_19;
  char *extraout_RDX_20;
  unsigned_short *in_R8;
  byte *pbVar13;
  uint uVar11;
  
  if (end <= ptr) {
    return -4;
  }
  pcVar12 = end;
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
  case 0:
  case 1:
  case 8:
    break;
  case 2:
    pbVar13 = (byte *)(ptr + 1);
    ppcVar8 = (char **)(end + -(long)pbVar13);
    if ((long)ppcVar8 < 1) {
      return -1;
    }
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar13)) {
    case 5:
      if (ppcVar8 == (char **)0x1) {
        return -2;
      }
      iVar4 = (*enc[3].literalScanners[0])
                        (enc,(char *)pbVar13,(char *)&switchD_0017c381::switchdataD_001ac604,ppcVar8
                        );
      if (iVar4 != 0) goto switchD_0017c381_caseD_8;
      iVar4 = (*enc[3].scanners[1])(enc,(char *)pbVar13,extraout_RDX_12,ppcVar8);
      lVar6 = 3;
      break;
    case 6:
      if ((long)ppcVar8 < 3) {
        return -2;
      }
      iVar4 = (*enc[3].literalScanners[1])
                        (enc,(char *)pbVar13,(char *)&switchD_0017c381::switchdataD_001ac604,ppcVar8
                        );
      if (iVar4 != 0) goto switchD_0017c381_caseD_8;
      iVar4 = (*enc[3].scanners[2])(enc,(char *)pbVar13,extraout_RDX_11,ppcVar8);
      lVar6 = 4;
      break;
    case 7:
      if ((long)ppcVar8 < 4) {
        return -2;
      }
      iVar4 = (*enc[3].nameMatchesAscii)
                        (enc,(char *)pbVar13,(char *)&switchD_0017c381::switchdataD_001ac604,
                         (char *)ppcVar8);
      if (iVar4 != 0) goto switchD_0017c381_caseD_8;
      iVar4 = (*enc[3].scanners[3])(enc,(char *)pbVar13,extraout_RDX_10,ppcVar8);
      lVar6 = 5;
      break;
    default:
      goto switchD_0017c381_caseD_8;
    case 0xf:
      iVar4 = normal_scanPi(enc,ptr + 2,end,nextTokPtr);
      return iVar4;
    case 0x10:
      pbVar9 = (byte *)(ptr + 2);
      if ((byte *)end == pbVar9 || (long)end - (long)pbVar9 < 0) {
        return -1;
      }
      cVar2 = *(char *)((long)enc[1].scanners + (ulong)*pbVar9);
      if (cVar2 != '\x14') {
        if (cVar2 != '\x1b') {
          *nextTokPtr = (char *)pbVar9;
          return 0;
        }
        iVar4 = normal_scanComment(enc,ptr + 3,end,nextTokPtr);
        return iVar4;
      }
      pcVar12 = ptr + 3;
      if ((long)end - (long)pcVar12 < 6) {
        return -1;
      }
      lVar6 = 0;
      while (pcVar12[lVar6] == (&big2_scanCdataSection_CDATA_LSQB)[lVar6]) {
        lVar6 = lVar6 + 1;
        if (lVar6 == 6) {
          *nextTokPtr = ptr + 9;
          return 8;
        }
      }
      pbVar9 = (byte *)(pcVar12 + lVar6);
      goto LAB_0017cacf;
    case 0x11:
      pbVar13 = (byte *)(ptr + 2);
      ppcVar8 = (char **)(end + -(long)pbVar13);
      if ((long)ppcVar8 < 1) {
        return -1;
      }
      bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar13);
      if (bVar1 < 0x16) {
        if (bVar1 == 5) {
          if (ppcVar8 == (char **)0x1) {
            return -2;
          }
          iVar4 = (*enc[3].literalScanners[0])
                            (enc,(char *)pbVar13,(char *)&switchD_0017c381::switchdataD_001ac604,
                             ppcVar8);
          if (iVar4 != 0) goto switchD_0017c381_caseD_8;
          iVar4 = (*enc[3].scanners[1])(enc,(char *)pbVar13,extraout_RDX_14,ppcVar8);
          lVar6 = 4;
        }
        else if (bVar1 == 6) {
          if ((long)ppcVar8 < 3) {
            return -2;
          }
          iVar4 = (*enc[3].literalScanners[1])
                            (enc,(char *)pbVar13,(char *)&switchD_0017c381::switchdataD_001ac604,
                             ppcVar8);
          if (iVar4 != 0) goto switchD_0017c381_caseD_8;
          iVar4 = (*enc[3].scanners[2])(enc,(char *)pbVar13,extraout_RDX_15,ppcVar8);
          lVar6 = 5;
        }
        else {
          if (bVar1 != 7) goto switchD_0017c381_caseD_8;
          if ((long)ppcVar8 < 4) {
            return -2;
          }
          iVar4 = (*enc[3].nameMatchesAscii)
                            (enc,(char *)pbVar13,(char *)&switchD_0017c381::switchdataD_001ac604,
                             (char *)ppcVar8);
          if (iVar4 != 0) goto switchD_0017c381_caseD_8;
          iVar4 = (*enc[3].scanners[3])(enc,(char *)pbVar13,extraout_RDX_13,ppcVar8);
          lVar6 = 6;
        }
        if (iVar4 == 0) goto switchD_0017c381_caseD_8;
      }
      else {
        lVar6 = 3;
        if ((bVar1 != 0x16) && (bVar1 != 0x18)) goto switchD_0017c381_caseD_8;
      }
      ptr = ptr + lVar6;
      do {
        lVar6 = (long)end - (long)ptr;
        if (lVar6 < 1) {
          return -1;
        }
        uVar11 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
        uVar10 = uVar11 - 5;
        if (0x18 < uVar10) goto switchD_0017c1fb_caseD_0;
        ppuVar7 = (unsigned_short **)0x1;
        pcVar12 = (char *)((long)&switchD_0017c9d0::switchdataD_001ac654 +
                          (long)(int)(&switchD_0017c9d0::switchdataD_001ac654)[uVar10]);
        switch(uVar11) {
        case 5:
          if (lVar6 == 1) {
            return -2;
          }
          iVar4 = (*enc[3].literalScanners[0])(enc,ptr,pcVar12,(char **)0x1);
          if (iVar4 != 0) goto switchD_0017c1fb_caseD_0;
          XVar5 = (*enc[2].utf16Convert)(enc,(char **)ptr,extraout_RDX_16,ppuVar7,in_R8);
          ppuVar7 = (unsigned_short **)0x2;
          break;
        case 6:
          if (lVar6 < 3) {
            return -2;
          }
          iVar4 = (*enc[3].literalScanners[1])(enc,ptr,pcVar12,(char **)0x1);
          if (iVar4 != 0) goto switchD_0017c1fb_caseD_0;
          XVar5 = (**(code **)&enc[2].minBytesPerChar)(enc,ptr);
          ppuVar7 = (unsigned_short **)0x3;
          break;
        case 7:
          if (lVar6 < 4) {
            return -2;
          }
          iVar4 = (*enc[3].nameMatchesAscii)(enc,ptr,pcVar12,(char *)0x1);
          if (iVar4 != 0) goto switchD_0017c1fb_caseD_0;
          XVar5 = (*enc[3].scanners[0])(enc,ptr,extraout_RDX_17,(char **)ppuVar7);
          ppuVar7 = (unsigned_short **)0x4;
          break;
        default:
          goto switchD_0017c1fb_caseD_0;
        case 9:
        case 10:
        case 0x15:
          ptr = (char *)((long)ptr + 1);
          lVar6 = (long)end - (long)ptr;
          while( true ) {
            if (lVar6 < 1) {
              return -1;
            }
            bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
            if ((1 < bVar1 - 9) && (bVar1 != 0x15)) break;
            ptr = (char *)((long)ptr + 1);
            lVar6 = lVar6 + -1;
          }
          if (bVar1 != 0xb) goto switchD_0017c1fb_caseD_0;
switchD_0017c9d0_caseD_b:
          *nextTokPtr = (char *)((long)ptr + 1);
          return 5;
        case 0xb:
          goto switchD_0017c9d0_caseD_b;
        case 0x16:
        case 0x17:
        case 0x18:
        case 0x19:
        case 0x1a:
        case 0x1b:
          goto switchD_0017c9d0_caseD_16;
        }
        if (XVar5 == XML_CONVERT_COMPLETED) goto switchD_0017c1fb_caseD_0;
switchD_0017c9d0_caseD_16:
        ptr = (char *)((long)ptr + (long)ppuVar7);
      } while( true );
    case 0x16:
    case 0x18:
      lVar6 = 2;
      goto LAB_0017c388;
    }
    if (iVar4 == 0) {
switchD_0017c381_caseD_8:
      *nextTokPtr = (char *)pbVar13;
      return 0;
    }
LAB_0017c388:
    ptr = ptr + lVar6;
    lVar6 = (long)end - (long)ptr;
    if (lVar6 < 1) {
      return -1;
    }
    bVar3 = false;
LAB_0017c3a9:
    uVar11 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
    uVar10 = uVar11 - 5;
    if (0x18 < uVar10) break;
    ppuVar7 = (unsigned_short **)0x1;
    pcVar12 = (char *)((long)&switchD_0017c3d0::switchdataD_001ac6b8 +
                      (long)(int)(&switchD_0017c3d0::switchdataD_001ac6b8)[uVar10]);
    switch(uVar11) {
    case 5:
      if (lVar6 == 1) {
        return -2;
      }
      iVar4 = (*enc[3].literalScanners[0])(enc,ptr,pcVar12,(char **)0x1);
      if (iVar4 != 0) goto switchD_0017c1fb_caseD_0;
      XVar5 = (*enc[2].utf16Convert)(enc,(char **)ptr,extraout_RDX_02,ppuVar7,in_R8);
      ppuVar7 = (unsigned_short **)0x2;
      break;
    case 6:
      if (lVar6 < 3) {
        return -2;
      }
      iVar4 = (*enc[3].literalScanners[1])(enc,ptr,pcVar12,(char **)0x1);
      if (iVar4 != 0) goto switchD_0017c1fb_caseD_0;
      XVar5 = (**(code **)&enc[2].minBytesPerChar)(enc,ptr);
      ppuVar7 = (unsigned_short **)0x3;
      break;
    case 7:
      if (lVar6 < 4) {
        return -2;
      }
      iVar4 = (*enc[3].nameMatchesAscii)(enc,ptr,pcVar12,(char *)0x1);
      if (iVar4 != 0) goto switchD_0017c1fb_caseD_0;
      XVar5 = (*enc[3].scanners[0])(enc,ptr,extraout_RDX_04,(char **)ppuVar7);
      ppuVar7 = (unsigned_short **)0x4;
      break;
    default:
      goto switchD_0017c1fb_caseD_0;
    case 9:
    case 10:
    case 0x15:
      ptr = (char *)((long)ptr + 1);
      ppcVar8 = (char **)(end + -(long)ptr);
      if ((long)ppcVar8 < 1) {
        return -1;
      }
      goto LAB_0017c8e7;
    case 0xb:
      goto switchD_0017c3d0_caseD_b;
    case 0x11:
      goto switchD_0017c3d0_caseD_11;
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
      goto switchD_0017c3d0_caseD_16;
    case 0x17:
      if (bVar3) goto switchD_0017c1fb_caseD_0;
      pbVar13 = (byte *)((long)ptr + 1);
      lVar6 = (long)end - (long)pbVar13;
      if (lVar6 < 1) {
        return -1;
      }
      ppcVar8 = (char **)(ulong)*pbVar13;
      bVar1 = *(byte *)((long)enc[1].scanners + (long)ppcVar8);
      pcVar12 = (char *)(ulong)bVar1;
      if (bVar1 < 0x16) {
        if (bVar1 == 5) {
          if (lVar6 == 1) {
            return -2;
          }
          iVar4 = (*enc[3].literalScanners[0])(enc,(char *)pbVar13,pcVar12,ppcVar8);
          if (iVar4 != 0) goto switchD_0017c381_caseD_8;
          iVar4 = (*enc[3].scanners[1])(enc,(char *)pbVar13,extraout_RDX_05,ppcVar8);
          ppuVar7 = (unsigned_short **)0x3;
        }
        else if (bVar1 == 6) {
          if (lVar6 < 3) {
            return -2;
          }
          iVar4 = (*enc[3].literalScanners[1])(enc,(char *)pbVar13,pcVar12,ppcVar8);
          if (iVar4 != 0) goto switchD_0017c381_caseD_8;
          iVar4 = (*enc[3].scanners[2])(enc,(char *)pbVar13,extraout_RDX_06,ppcVar8);
          ppuVar7 = (unsigned_short **)0x4;
        }
        else {
          if (bVar1 != 7) goto switchD_0017c381_caseD_8;
          if (lVar6 < 4) {
            return -2;
          }
          iVar4 = (*enc[3].nameMatchesAscii)(enc,(char *)pbVar13,pcVar12,(char *)ppcVar8);
          if (iVar4 != 0) goto switchD_0017c381_caseD_8;
          iVar4 = (*enc[3].scanners[3])(enc,(char *)pbVar13,extraout_RDX_03,ppcVar8);
          ppuVar7 = (unsigned_short **)0x5;
        }
        bVar3 = true;
        if (iVar4 != 0) goto switchD_0017c3d0_caseD_16;
        goto switchD_0017c381_caseD_8;
      }
      bVar3 = true;
      ppuVar7 = (unsigned_short **)0x2;
      if ((bVar1 != 0x16) && (bVar1 != 0x18)) goto switchD_0017c381_caseD_8;
      goto switchD_0017c3d0_caseD_16;
    }
    if (XVar5 == XML_CONVERT_COMPLETED) break;
switchD_0017c3d0_caseD_16:
    ptr = (char *)((long)ptr + (long)ppuVar7);
    lVar6 = (long)end - (long)ptr;
    if (lVar6 < 1) {
      return -1;
    }
    goto LAB_0017c3a9;
  case 3:
    iVar4 = normal_scanRef(enc,ptr + 1,end,nextTokPtr);
    return iVar4;
  case 4:
    pbVar9 = (byte *)(ptr + 1);
    if ((byte *)end == pbVar9 || (long)end - (long)pbVar9 < 0) {
      return -5;
    }
    if (*pbVar9 == 0x5d) {
      ptr = ptr + 2;
      if (end == ptr || (long)end - (long)ptr < 0) {
        return -5;
      }
      if (*ptr == 0x3e) break;
    }
    goto joined_r0x0017c5c9;
  case 5:
    if ((long)(end + -(long)ptr) < 2) {
      return -2;
    }
    iVar4 = (*enc[3].literalScanners[0])(enc,ptr,end,(char **)(end + -(long)ptr));
    if (iVar4 == 0) {
      pcVar12 = extraout_RDX_00;
      pbVar9 = (byte *)(ptr + 2);
      goto joined_r0x0017c5c9;
    }
    break;
  case 6:
    if ((long)(end + -(long)ptr) < 3) {
      return -2;
    }
    iVar4 = (*enc[3].literalScanners[1])(enc,ptr,end,(char **)(end + -(long)ptr));
    if (iVar4 == 0) {
      pcVar12 = extraout_RDX;
      pbVar9 = (byte *)(ptr + 3);
      goto joined_r0x0017c5c9;
    }
    break;
  case 7:
    if ((long)(end + -(long)ptr) < 4) {
      return -2;
    }
    iVar4 = (*enc[3].nameMatchesAscii)(enc,ptr,end,end + -(long)ptr);
    if (iVar4 == 0) {
      pcVar12 = extraout_RDX_01;
      pbVar9 = (byte *)(ptr + 4);
      goto joined_r0x0017c5c9;
    }
    break;
  case 9:
    pcVar12 = ptr + 1;
    if (end != pcVar12 && -1 < (long)end - (long)pcVar12) {
      if (*(char *)((long)enc[1].scanners + (ulong)(byte)ptr[1]) == '\n') {
        pcVar12 = ptr + 2;
      }
      *nextTokPtr = pcVar12;
      return 7;
    }
    return -3;
  case 10:
    *nextTokPtr = ptr + 1;
    return 7;
  default:
    pbVar9 = (byte *)(ptr + 1);
joined_r0x0017c5c9:
    while( true ) {
      pbVar13 = pbVar9;
      lVar6 = (long)end - (long)pbVar13;
      if (lVar6 < 1) {
        *nextTokPtr = (char *)pbVar13;
        return 6;
      }
      bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar13);
      if ((ulong)bVar1 < 0xb) break;
      pbVar9 = pbVar13 + 1;
    }
    ppcVar8 = (char **)((long)&switchD_0017c5f5::switchdataD_001ac780 +
                       (long)(int)(&switchD_0017c5f5::switchdataD_001ac780)[bVar1]);
    switch(bVar1) {
    case 4:
      if (lVar6 == 1) break;
      pbVar9 = pbVar13 + 1;
      if (pbVar13[1] != 0x5d) goto joined_r0x0017c5c9;
      if (lVar6 < 3) break;
      if (pbVar13[2] == 0x3e) goto LAB_0017c856;
      goto joined_r0x0017c5c9;
    case 5:
      if ((lVar6 != 1) &&
         (iVar4 = (*enc[3].literalScanners[0])(enc,(char *)pbVar13,pcVar12,ppcVar8), iVar4 == 0)) {
        pcVar12 = extraout_RDX_08;
        pbVar9 = pbVar13 + 2;
        goto joined_r0x0017c5c9;
      }
      break;
    case 6:
      if ((2 < lVar6) &&
         (iVar4 = (*enc[3].literalScanners[1])(enc,(char *)pbVar13,pcVar12,ppcVar8), iVar4 == 0)) {
        pcVar12 = extraout_RDX_07;
        pbVar9 = pbVar13 + 3;
        goto joined_r0x0017c5c9;
      }
      break;
    case 7:
      if ((3 < lVar6) &&
         (iVar4 = (*enc[3].nameMatchesAscii)(enc,(char *)pbVar13,pcVar12,(char *)ppcVar8),
         iVar4 == 0)) {
        pcVar12 = extraout_RDX_09;
        pbVar9 = pbVar13 + 4;
        goto joined_r0x0017c5c9;
      }
    }
    *nextTokPtr = (char *)pbVar13;
    return 6;
  }
switchD_0017c1fb_caseD_0:
  *nextTokPtr = ptr;
  return 0;
LAB_0017c856:
  pbVar13 = pbVar13 + 2;
  goto switchD_0017c381_caseD_8;
LAB_0017c8e7:
  uVar11 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  uVar10 = uVar11 - 5;
  if (uVar10 < 0x19) {
    pcVar12 = (char *)((long)&switchD_0017c908::switchdataD_001ac71c +
                      (long)(int)(&switchD_0017c908::switchdataD_001ac71c)[uVar10]);
    switch(uVar11) {
    case 5:
      if (ppcVar8 == (char **)0x1) {
        return -2;
      }
      iVar4 = (*enc[3].literalScanners[0])(enc,ptr,pcVar12,ppcVar8);
      if (iVar4 != 0) goto switchD_0017c1fb_caseD_0;
      iVar4 = (*enc[3].scanners[1])(enc,ptr,extraout_RDX_19,ppcVar8);
      lVar6 = 3;
      break;
    case 6:
      if (ppcVar8 < (char **)0x3) {
        return -2;
      }
      iVar4 = (*enc[3].literalScanners[1])(enc,ptr,pcVar12,ppcVar8);
      if (iVar4 != 0) goto switchD_0017c1fb_caseD_0;
      iVar4 = (*enc[3].scanners[2])(enc,ptr,extraout_RDX_18,ppcVar8);
      lVar6 = 4;
      break;
    case 7:
      if (ppcVar8 < (char **)0x4) {
        return -2;
      }
      iVar4 = (*enc[3].nameMatchesAscii)(enc,ptr,pcVar12,(char *)ppcVar8);
      if (iVar4 != 0) goto switchD_0017c1fb_caseD_0;
      iVar4 = (*enc[3].scanners[3])(enc,ptr,extraout_RDX_20,ppcVar8);
      lVar6 = 5;
      break;
    default:
      goto switchD_0017c1fb_caseD_0;
    case 9:
    case 10:
    case 0x15:
      goto switchD_0017c908_caseD_9;
    case 0xb:
      goto switchD_0017c3d0_caseD_b;
    case 0x11:
      goto switchD_0017c3d0_caseD_11;
    case 0x16:
    case 0x18:
      lVar6 = 2;
      goto LAB_0017cb0e;
    }
    if (iVar4 != 0) {
LAB_0017cb0e:
      iVar4 = normal_scanAtts(enc,(char *)((long)ptr + lVar6 + -1),end,nextTokPtr);
      return iVar4;
    }
  }
  goto switchD_0017c1fb_caseD_0;
switchD_0017c908_caseD_9:
  ptr = (char *)((long)ptr + 1);
  ppcVar8 = (char **)((long)ppcVar8 + -1);
  if ((long)ppcVar8 < 1) {
    return -1;
  }
  goto LAB_0017c8e7;
switchD_0017c3d0_caseD_b:
  *nextTokPtr = (char *)((long)ptr + 1);
  return 2;
switchD_0017c3d0_caseD_11:
  pbVar9 = (byte *)((long)ptr + 1);
  if ((byte *)end == pbVar9 || (long)end - (long)pbVar9 < 0) {
    return -1;
  }
  if (*pbVar9 == 0x3e) {
    *nextTokPtr = (char *)((long)ptr + 2);
    return 4;
  }
LAB_0017cacf:
  *nextTokPtr = (char *)pbVar9;
  return 0;
}

Assistant:

static int PTRCALL
PREFIX(contentTok)(const ENCODING *enc, const char *ptr, const char *end,
                   const char **nextTokPtr) {
  if (ptr >= end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_LT:
    return PREFIX(scanLt)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_AMP:
    return PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_CR:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_CR;
    if (BYTE_TYPE(enc, ptr) == BT_LF)
      ptr += MINBPC(enc);
    *nextTokPtr = ptr;
    return XML_TOK_DATA_NEWLINE;
  case BT_LF:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DATA_NEWLINE;
  case BT_RSQB:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_RSQB;
    if (! CHAR_MATCHES(enc, ptr, ASCII_RSQB))
      break;
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_RSQB;
    if (! CHAR_MATCHES(enc, ptr, ASCII_GT)) {
      ptr -= MINBPC(enc);
      break;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
    INVALID_CASES(ptr, nextTokPtr)
  default:
    ptr += MINBPC(enc);
    break;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
#  define LEAD_CASE(n)                                                         \
  case BT_LEAD##n:                                                             \
    if (end - ptr < n || IS_INVALID_CHAR(enc, ptr, n)) {                       \
      *nextTokPtr = ptr;                                                       \
      return XML_TOK_DATA_CHARS;                                               \
    }                                                                          \
    ptr += n;                                                                  \
    break;
      LEAD_CASE(2)
      LEAD_CASE(3)
      LEAD_CASE(4)
#  undef LEAD_CASE
    case BT_RSQB:
      if (HAS_CHARS(enc, ptr, end, 2)) {
        if (! CHAR_MATCHES(enc, ptr + MINBPC(enc), ASCII_RSQB)) {
          ptr += MINBPC(enc);
          break;
        }
        if (HAS_CHARS(enc, ptr, end, 3)) {
          if (! CHAR_MATCHES(enc, ptr + 2 * MINBPC(enc), ASCII_GT)) {
            ptr += MINBPC(enc);
            break;
          }
          *nextTokPtr = ptr + 2 * MINBPC(enc);
          return XML_TOK_INVALID;
        }
      }
      /* fall through */
    case BT_AMP:
    case BT_LT:
    case BT_NONXML:
    case BT_MALFORM:
    case BT_TRAIL:
    case BT_CR:
    case BT_LF:
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_DATA_CHARS;
}